

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall
re2::TestInstance::TestInstance
          (TestInstance *this,StringPiece *regexp_str,MatchKind kind,ParseFlags flags)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  ParseFlags PVar4;
  Regexp *pRVar5;
  ostream *poVar6;
  Prog *pPVar7;
  RE2 *this_00;
  ulong uVar8;
  PCRE *this_01;
  StringPiece local_d58;
  re2 local_d48 [32];
  LogMessage local_d28;
  undefined1 local_ba1;
  string local_ba0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80 [32];
  undefined1 local_b60 [8];
  PCRE_Options o;
  re2 local_b40 [32];
  LogMessage local_b20;
  StringPiece local_9a0;
  undefined1 local_990 [8];
  Options options;
  string local_958 [32];
  string local_938 [32];
  undefined1 local_918 [8];
  string re;
  undefined1 local_8f8 [416];
  re2 local_758 [32];
  LogMessage local_738;
  undefined1 local_5b8 [64];
  re2 local_578 [32];
  re2 local_558 [32];
  LogMessage local_538;
  re2 local_3b8 [32];
  LogMessage local_398;
  undefined4 local_214;
  re2 local_210 [32];
  re2 local_1f0 [32];
  LogMessage local_1d0;
  undefined1 local_40 [8];
  RegexpStatus status;
  ParseFlags flags_local;
  MatchKind kind_local;
  StringPiece *regexp_str_local;
  TestInstance *this_local;
  
  this->regexp_str_ = regexp_str;
  this->kind_ = kind;
  this->flags_ = flags;
  this->error_ = false;
  this->regexp_ = (Regexp *)0x0;
  this->num_captures_ = 0;
  this->prog_ = (Prog *)0x0;
  this->rprog_ = (Prog *)0x0;
  this->re_ = (PCRE *)0x0;
  this->re2_ = (RE2 *)0x0;
  status.tmp_._0_4_ = flags;
  status.tmp_._4_4_ = kind;
  RegexpStatus::RegexpStatus((RegexpStatus *)local_40);
  pRVar5 = Regexp::Parse(regexp_str,(ParseFlags)status.tmp_,(RegexpStatus *)local_40);
  this->regexp_ = pRVar5;
  if (this->regexp_ == (Regexp *)0x0) {
    LogMessage::LogMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xb6,0);
    poVar6 = LogMessage::stream(&local_1d0);
    poVar6 = std::operator<<(poVar6,"Cannot parse: ");
    CEscape_abi_cxx11_(local_1f0,this->regexp_str_);
    poVar6 = std::operator<<(poVar6,(string *)local_1f0);
    poVar6 = std::operator<<(poVar6," mode: ");
    FormatMode_abi_cxx11_(local_210,(ParseFlags)status.tmp_);
    std::operator<<(poVar6,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string((string *)local_1f0);
    LogMessage::~LogMessage(&local_1d0);
    this->error_ = true;
    local_214 = 1;
    goto LAB_00151b90;
  }
  iVar2 = Regexp::NumCaptures(this->regexp_);
  this->num_captures_ = iVar2;
  pPVar7 = Regexp::CompileToProg(this->regexp_,0);
  this->prog_ = pPVar7;
  if (this->prog_ == (Prog *)0x0) {
    LogMessage::LogMessage
              (&local_398,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xbe,0);
    poVar6 = LogMessage::stream(&local_398);
    poVar6 = std::operator<<(poVar6,"Cannot compile: ");
    CEscape_abi_cxx11_(local_3b8,this->regexp_str_);
    std::operator<<(poVar6,(string *)local_3b8);
    std::__cxx11::string::~string((string *)local_3b8);
    LogMessage::~LogMessage(&local_398);
    this->error_ = true;
    local_214 = 1;
    goto LAB_00151b90;
  }
  if ((FLAGS_dump_prog & 1) != 0) {
    LogMessage::LogMessage
              (&local_538,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xc3,0);
    poVar6 = LogMessage::stream(&local_538);
    poVar6 = std::operator<<(poVar6,"Prog for ");
    poVar6 = std::operator<<(poVar6," regexp ");
    CEscape_abi_cxx11_(local_558,this->regexp_str_);
    poVar6 = std::operator<<(poVar6,(string *)local_558);
    poVar6 = std::operator<<(poVar6," (");
    FormatKind_abi_cxx11_(local_578,this->kind_);
    poVar6 = std::operator<<(poVar6,(string *)local_578);
    poVar6 = std::operator<<(poVar6,", ");
    FormatMode_abi_cxx11_((re2 *)(local_5b8 + 0x20),this->flags_);
    poVar6 = std::operator<<(poVar6,(string *)(local_5b8 + 0x20));
    poVar6 = std::operator<<(poVar6,")\n");
    Prog::Dump_abi_cxx11_((Prog *)local_5b8);
    std::operator<<(poVar6,(string *)local_5b8);
    std::__cxx11::string::~string((string *)local_5b8);
    std::__cxx11::string::~string((string *)(local_5b8 + 0x20));
    std::__cxx11::string::~string((string *)local_578);
    std::__cxx11::string::~string((string *)local_558);
    LogMessage::~LogMessage(&local_538);
  }
  uVar3 = Engines();
  if ((uVar3 & 0xc) != 0) {
    pPVar7 = Regexp::CompileToReverseProg(this->regexp_,0);
    this->rprog_ = pPVar7;
    if (this->rprog_ == (Prog *)0x0) {
      LogMessage::LogMessage
                (&local_738,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0xd0,0);
      poVar6 = LogMessage::stream(&local_738);
      poVar6 = std::operator<<(poVar6,"Cannot reverse compile: ");
      CEscape_abi_cxx11_(local_758,this->regexp_str_);
      std::operator<<(poVar6,(string *)local_758);
      std::__cxx11::string::~string((string *)local_758);
      LogMessage::~LogMessage(&local_738);
      this->error_ = true;
      local_214 = 1;
      goto LAB_00151b90;
    }
    if ((FLAGS_dump_rprog & 1) != 0) {
      LogMessage::LogMessage
                ((LogMessage *)(local_8f8 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                 ,0xd5,0);
      poVar6 = LogMessage::stream((LogMessage *)(local_8f8 + 0x20));
      Prog::Dump_abi_cxx11_((Prog *)local_8f8);
      std::operator<<(poVar6,(string *)local_8f8);
      std::__cxx11::string::~string((string *)local_8f8);
      LogMessage::~LogMessage((LogMessage *)(local_8f8 + 0x20));
    }
  }
  StringPiece::as_string_abi_cxx11_((StringPiece *)local_918);
  PVar4 = operator&((ParseFlags)status.tmp_,OneLine);
  if (PVar4 == NoParseFlags) {
    std::operator+((char *)local_938,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(?m)");
    std::__cxx11::string::operator=((string *)local_918,local_938);
    std::__cxx11::string::~string(local_938);
  }
  PVar4 = operator&((ParseFlags)status.tmp_,NonGreedy);
  if (PVar4 != NoParseFlags) {
    std::operator+((char *)local_958,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(?U)");
    std::__cxx11::string::operator=((string *)local_918,local_958);
    std::__cxx11::string::~string(local_958);
  }
  PVar4 = operator&((ParseFlags)status.tmp_,DotNL);
  if (PVar4 != NoParseFlags) {
    std::operator+(&options.literal_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(?s)");
    std::__cxx11::string::operator=((string *)local_918,(string *)&options.literal_);
    std::__cxx11::string::~string((string *)&options.literal_);
  }
  uVar3 = Engines();
  if ((uVar3 & 0x1c0) == 0) {
LAB_001518b5:
    uVar3 = Engines();
    if ((((uVar3 & 0x200) != 0) && (bVar1 = Regexp::MimicsPCRE(this->regexp_), bVar1)) &&
       (this->kind_ != kLongestMatch)) {
      PCRE_Options::PCRE_Options((PCRE_Options *)local_b60);
      PCRE_Options::set_option((PCRE_Options *)local_b60,EnabledCompileOptions);
      PVar4 = operator&((ParseFlags)status.tmp_,Latin1);
      if (PVar4 != NoParseFlags) {
        PCRE_Options::set_option((PCRE_Options *)local_b60,EnabledExecOptions);
      }
      this_01 = (PCRE *)operator_new(0x50);
      local_ba1 = 1;
      std::operator+((char *)local_ba0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19d4c6);
      std::operator+(local_b80,(char *)local_ba0);
      PCRE::PCRE(this_01,local_b80,(PCRE_Options *)local_b60);
      local_ba1 = 0;
      this->re_ = this_01;
      std::__cxx11::string::~string((string *)local_b80);
      std::__cxx11::string::~string(local_ba0);
      PCRE::error_abi_cxx11_(this->re_);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        LogMessage::LogMessage
                  (&local_d28,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x106,0);
        poVar6 = LogMessage::stream(&local_d28);
        poVar6 = std::operator<<(poVar6,"Cannot PCRE: ");
        StringPiece::StringPiece(&local_d58,(string *)local_918);
        CEscape_abi_cxx11_(local_d48,&local_d58);
        std::operator<<(poVar6,(string *)local_d48);
        std::__cxx11::string::~string((string *)local_d48);
        LogMessage::~LogMessage(&local_d28);
        this->error_ = true;
        local_214 = 1;
        goto LAB_00151b84;
      }
    }
    local_214 = 0;
  }
  else {
    RE2::Options::Options((Options *)local_990);
    PVar4 = operator&((ParseFlags)status.tmp_,Latin1);
    if (PVar4 != NoParseFlags) {
      RE2::Options::set_encoding((Options *)local_990,EncodingLatin1);
    }
    if (this->kind_ == kLongestMatch) {
      RE2::Options::set_longest_match((Options *)local_990,true);
    }
    this_00 = (RE2 *)operator_new(0xe0);
    StringPiece::StringPiece(&local_9a0,(string *)local_918);
    RE2::RE2(this_00,&local_9a0,(Options *)local_990);
    this->re2_ = this_00;
    RE2::error_abi_cxx11_(this->re2_);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) goto LAB_001518b5;
    LogMessage::LogMessage
              (&local_b20,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0xec,0);
    poVar6 = LogMessage::stream(&local_b20);
    poVar6 = std::operator<<(poVar6,"Cannot RE2: ");
    StringPiece::StringPiece((StringPiece *)&o.stack_limit_,(string *)local_918);
    CEscape_abi_cxx11_(local_b40,(StringPiece *)&o.stack_limit_);
    std::operator<<(poVar6,(string *)local_b40);
    std::__cxx11::string::~string((string *)local_b40);
    LogMessage::~LogMessage(&local_b20);
    this->error_ = true;
    local_214 = 1;
  }
LAB_00151b84:
  std::__cxx11::string::~string((string *)local_918);
LAB_00151b90:
  RegexpStatus::~RegexpStatus((RegexpStatus *)local_40);
  return;
}

Assistant:

TestInstance::TestInstance(const StringPiece& regexp_str, Prog::MatchKind kind,
                           Regexp::ParseFlags flags)
  : regexp_str_(regexp_str),
    kind_(kind),
    flags_(flags),
    error_(false),
    regexp_(NULL),
    num_captures_(0),
    prog_(NULL),
    rprog_(NULL),
    re_(NULL),
    re2_(NULL) {

  VLOG(1) << CEscape(regexp_str);

  // Compile regexp to prog.
  // Always required - needed for backtracking (reference implementation).
  RegexpStatus status;
  regexp_ = Regexp::Parse(regexp_str, flags, &status);
  if (regexp_ == NULL) {
    LOG(INFO) << "Cannot parse: " << CEscape(regexp_str_)
              << " mode: " << FormatMode(flags);
    error_ = true;
    return;
  }
  num_captures_ = regexp_->NumCaptures();
  prog_ = regexp_->CompileToProg(0);
  if (prog_ == NULL) {
    LOG(INFO) << "Cannot compile: " << CEscape(regexp_str_);
    error_ = true;
    return;
  }
  if (FLAGS_dump_prog) {
    LOG(INFO) << "Prog for "
              << " regexp "
              << CEscape(regexp_str_)
              << " (" << FormatKind(kind_)
              << ", " << FormatMode(flags_)
              << ")\n"
              << prog_->Dump();
  }

  // Compile regexp to reversed prog.  Only needed for DFA engines.
  if (Engines() & ((1<<kEngineDFA)|(1<<kEngineDFA1))) {
    rprog_ = regexp_->CompileToReverseProg(0);
    if (rprog_ == NULL) {
      LOG(INFO) << "Cannot reverse compile: " << CEscape(regexp_str_);
      error_ = true;
      return;
    }
    if (FLAGS_dump_rprog)
      LOG(INFO) << rprog_->Dump();
  }

  // Create re string that will be used for RE and RE2.
  string re = regexp_str.as_string();
  // Accomodate flags.
  // Regexp::Latin1 will be accomodated below.
  if (!(flags & Regexp::OneLine))
    re = "(?m)" + re;
  if (flags & Regexp::NonGreedy)
    re = "(?U)" + re;
  if (flags & Regexp::DotNL)
    re = "(?s)" + re;

  // Compile regexp to RE2.
  if (Engines() & ((1<<kEngineRE2)|(1<<kEngineRE2a)|(1<<kEngineRE2b))) {
    RE2::Options options;
    if (flags & Regexp::Latin1)
      options.set_encoding(RE2::Options::EncodingLatin1);
    if (kind_ == Prog::kLongestMatch)
      options.set_longest_match(true);
    re2_ = new RE2(re, options);
    if (!re2_->error().empty()) {
      LOG(INFO) << "Cannot RE2: " << CEscape(re);
      error_ = true;
      return;
    }
  }

  // Compile regexp to RE.
  // PCRE as exposed by the RE interface isn't always usable.
  // 1. It disagrees about handling of empty-string reptitions
  //    like matching (a*)* against "b".  PCRE treats the (a*) as
  //    occurring once, while we treat it as occurring not at all.
  // 2. It treats $ as this weird thing meaning end of string
  //    or before the \n at the end of the string.
  // 3. It doesn't implement POSIX leftmost-longest matching.
  // 4. It lets \s match vertical tab.
  // MimicsPCRE() detects 1 and 2.
  if ((Engines() & (1<<kEnginePCRE)) && regexp_->MimicsPCRE() &&
      kind_ != Prog::kLongestMatch) {
    PCRE_Options o;
    o.set_option(PCRE::UTF8);
    if (flags & Regexp::Latin1)
      o.set_option(PCRE::None);
    // PCRE has interface bug keeping us from finding $0, so
    // add one more layer of parens.
    re_ = new PCRE("("+re+")", o);
    if (!re_->error().empty()) {
      LOG(INFO) << "Cannot PCRE: " << CEscape(re);
      error_ = true;
      return;
    }
  }
}